

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

char * linenoise(char *prompt)

{
  ushort *puVar1;
  bool bVar2;
  linenoiseCompletionCallback *plVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ssize_t sVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  int *piVar14;
  char *pcVar15;
  int ifd;
  uint uVar16;
  winsize *unaff_R15;
  undefined1 auStack_1080 [8];
  char local_1078 [8];
  char buf [4096];
  undefined1 local_70 [2];
  ushort local_6e;
  winsize ws;
  linenoiseCompletions lc;
  char local_35;
  byte local_34;
  char local_33;
  byte local_32;
  byte local_31 [7];
  char c_1;
  char c;
  
  auStack_1080 = (undefined1  [8])0x10a08f;
  pcVar9 = getenv("TERM");
  if (pcVar9 != (char *)0x0) {
    unaff_R15 = (winsize *)0x0;
LAB_0010a0a1:
    auStack_1080 = (undefined1  [8])0x10a0ad;
    iVar5 = strcasecmp(pcVar9,(char *)unaff_R15[0x221ac]);
    if (iVar5 != 0) goto code_r0x0010a0b5;
    auStack_1080 = (undefined1  [8])0x10a204;
    printf("%s",prompt);
    auStack_1080 = (undefined1  [8])0x10a213;
    fflush(_stdout);
    auStack_1080 = (undefined1  [8])0x10a22e;
    pcVar9 = fgets(local_1078,0x1000,_stdin);
    if (pcVar9 == (char *)0x0) {
      return (char *)0x0;
    }
    auStack_1080 = (undefined1  [8])0x10a243;
    for (sVar11 = strlen(local_1078);
        (sVar11 != 0 && ((local_1078[sVar11 - 1] == '\r' || (local_1078[sVar11 - 1] == '\n'))));
        sVar11 = sVar11 - 1) {
      local_1078[sVar11 - 1] = '\0';
    }
    goto LAB_0010aa31;
  }
LAB_0010a0bf:
  auStack_1080 = (undefined1  [8])0x10a0c6;
  iVar5 = isatty(0);
  if (iVar5 == 0) {
    auStack_1080 = (undefined1  [8])0x10a28f;
    pcVar9 = fgets(local_1078,0x1000,_stdin);
    if (pcVar9 != (char *)0x0) {
      auStack_1080 = (undefined1  [8])0x10a2a0;
      sVar11 = strlen(local_1078);
      iVar5 = (int)sVar11;
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else if (local_1078[iVar5 + -1] == '\n') {
        local_1078[(long)iVar5 + -1] = '\0';
        iVar5 = iVar5 + -1;
      }
      goto LAB_0010aa2b;
    }
  }
  else {
    auStack_1080 = (undefined1  [8])0x10a0d5;
    iVar5 = linenoiseEnableRawMode(0);
    if (iVar5 != -1) {
      ls.ifd = 0;
      ls.ofd = 1;
      ls.buf = local_1078;
      ls.buflen = 0x1000;
      auStack_1080 = (undefined1  [8])0x10a117;
      ls.prompt = prompt;
      ls.plen = strlen(prompt);
      ls.pos = 0;
      ls.oldpos = 0;
      ls.len = 0;
      iVar8 = 0x5413;
      ifd = 1;
      auStack_1080 = (undefined1  [8])0x10a14b;
      iVar5 = ioctl(1,0x5413,local_70);
      if (local_6e == 0 || iVar5 == -1) {
        auStack_1080 = (undefined1  [8])0x10a16c;
        uVar6 = getCursorPosition(ifd,iVar8);
        uVar16 = 0x50;
        if (uVar6 != 0xffffffff) {
          unaff_R15 = (winsize *)(ulong)uVar6;
          iVar5 = 0x10dc8a;
          iVar8 = 1;
          auStack_1080 = (undefined1  [8])0x10a194;
          sVar10 = write(1,"\x1b[999C",6);
          if (sVar10 == 6) {
            auStack_1080 = (undefined1  [8])0x10a1a3;
            uVar7 = getCursorPosition(iVar8,iVar5);
            if ((uVar7 != 0xffffffff) && (uVar16 = uVar7, (int)uVar6 < (int)uVar7)) {
              unaff_R15 = &ws;
              auStack_1080 = (undefined1  [8])0x10a1d0;
              snprintf((char *)unaff_R15,0x20,"\x1b[%dD");
              auStack_1080 = (undefined1  [8])0x10a1d8;
              sVar11 = strlen((char *)unaff_R15);
              auStack_1080 = (undefined1  [8])0x10a1e8;
              write(1,unaff_R15,sVar11);
            }
          }
        }
      }
      else {
        uVar16 = (uint)local_6e;
      }
      ls.cols = (size_t)(int)uVar16;
      ls.maxrows = 0;
      ls.history_index = 0;
      *ls.buf = '\0';
      ls.buflen = ls.buflen - 1;
      auStack_1080 = (undefined1  [8])0x10a320;
      linenoiseHistoryAdd("");
      auStack_1080 = (undefined1  [8])0x10a335;
      sVar10 = write(ls.ofd,prompt,ls.plen);
      if (sVar10 == -1) {
        unaff_R15 = (winsize *)0xffffffff;
      }
      else {
        do {
          auStack_1080 = (undefined1  [8])0x10a35a;
          sVar10 = read(ls.ifd,local_31,1);
          plVar3 = completionCallback;
          pcVar9 = ls.buf;
          if ((int)sVar10 < 1) {
LAB_0010a694:
            unaff_R15 = (winsize *)(ls.len & 0xffffffff);
            goto LAB_0010a69b;
          }
          if (completionCallback != (linenoiseCompletionCallback *)0x0 && local_31[0] == 9) {
            ws.ws_row = 0;
            ws.ws_col = 0;
            ws.ws_xpixel = 0;
            ws.ws_ypixel = 0;
            local_32 = 0;
            auStack_1080 = (undefined1  [8])0x10a3a8;
            pcVar12 = strrchr(ls.buf,0x20);
            pcVar15 = pcVar12 + 1;
            if (pcVar12 == (char *)0x0) {
              pcVar15 = pcVar9;
            }
            auStack_1080 = (undefined1  [8])0x10a3bf;
            (*plVar3)(pcVar9,pcVar15,(linenoiseCompletions *)&ws);
            auStack_1080 = (undefined1  [8])0x10a467;
            buf._4088_8_ = unaff_R15;
            fputc(7,_stderr);
            auStack_1080 = (undefined1  [8])0x10a46f;
            fflush(_stderr);
            auStack_1080 = (undefined1  [8])0x10a5b4;
            freeCompletions((linenoiseCompletions *)&ws);
            local_31[0] = local_32;
            if ((int)((uint)local_32 << 0x18) < 0) goto LAB_0010a694;
            unaff_R15 = (winsize *)buf._4088_8_;
            if (local_32 != 0) goto LAB_0010a5ce;
            goto switchD_0010a982_caseD_45;
          }
LAB_0010a5ce:
          sVar4 = ls.pos;
          switch(local_31[0]) {
          case 1:
switchD_0010a5ea_caseD_1:
            if (ls.pos != 0) {
              ls.pos = 0;
              sVar4 = ls.pos;
              goto LAB_0010a9df;
            }
            break;
          case 2:
switchD_0010a5ea_caseD_2:
            if (ls.pos != 0) {
              sVar4 = ls.pos - 1;
              goto LAB_0010a9df;
            }
            break;
          case 3:
            auStack_1080 = (undefined1  [8])0x10a6c6;
            piVar14 = __errno_location();
            *piVar14 = 0xb;
            goto LAB_0010a94d;
          case 4:
            if (ls.len == 0) {
              lVar13 = (long)history_len;
              history_len = history_len + -1;
              auStack_1080 = (undefined1  [8])0x10a94d;
              free(history[lVar13 + -1]);
              goto LAB_0010a94d;
            }
LAB_0010a6b0:
            auStack_1080 = (undefined1  [8])0x10a6bc;
            linenoiseEditDelete(&ls);
            break;
          case 5:
switchD_0010a5ea_caseD_5:
            sVar4 = ls.len;
            if (ls.pos != ls.len) goto LAB_0010a9df;
            break;
          case 6:
switchD_0010a5ea_caseD_6:
            if (ls.pos != ls.len) {
LAB_0010a9d5:
              sVar4 = ls.pos + 1;
              goto LAB_0010a9df;
            }
            break;
          case 7:
          case 9:
          case 10:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x13:
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
            goto switchD_0010a5ea_caseD_7;
          case 8:
switchD_0010a5ea_caseD_8:
            auStack_1080 = (undefined1  [8])0x10a61b;
            linenoiseEditBackspace(&ls);
            break;
          case 0xb:
            local_1078[ls.pos] = '\0';
            ls.len = ls.pos;
            goto LAB_0010a9df;
          case 0xc:
            auStack_1080 = (undefined1  [8])0x10a759;
            write(1,"\x1b[H\x1b[2J",7);
            sVar4 = ls.pos;
            goto LAB_0010a9df;
          case 0xd:
            lVar13 = (long)history_len;
            history_len = history_len + -1;
            auStack_1080 = (undefined1  [8])0x10a66f;
            free(history[lVar13 + -1]);
            if ((mlmode != 0) && (ls.pos != ls.len)) {
              ls.pos = ls.len;
              auStack_1080 = (undefined1  [8])0x10a694;
              linenoiseRefreshLine();
            }
            goto LAB_0010a694;
          case 0xe:
switchD_0010a5ea_caseD_e:
            iVar5 = 0;
            goto LAB_0010a9be;
          case 0x10:
switchD_0010a5ea_caseD_10:
            iVar5 = 1;
LAB_0010a9be:
            auStack_1080 = (undefined1  [8])0x10a9c3;
            linenoiseEditHistoryNext(&ls,iVar5);
            break;
          case 0x14:
            if (ls.pos < ls.len && ls.pos != 0) {
              puVar1 = (ushort *)(local_1078 + (ls.pos - 1));
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              if (ls.pos != ls.len - 1) goto LAB_0010a9d5;
              goto LAB_0010a9df;
            }
            break;
          case 0x15:
            local_1078[0] = '\0';
            ls.len = 0;
            sVar4 = 0;
LAB_0010a9df:
            ls.pos = sVar4;
            auStack_1080 = (undefined1  [8])0x10a9e4;
            linenoiseRefreshLine();
            break;
          case 0x17:
            auStack_1080 = (undefined1  [8])0x10a648;
            linenoiseEditDeletePrevWord(&ls);
            break;
          case 0x1b:
            auStack_1080 = (undefined1  [8])0x10a772;
            sVar10 = read(ls.ifd,&local_35,1);
            if (sVar10 != -1) {
              auStack_1080 = (undefined1  [8])0x10a790;
              sVar10 = read(ls.ifd,&local_34,1);
              if (sVar10 != -1) {
                if (local_35 == 'O') {
                  if (local_34 == 0x46) goto switchD_0010a5ea_caseD_5;
                  if (local_34 == 0x48) goto switchD_0010a5ea_caseD_1;
                }
                else if (local_35 == '[') {
                  if ((byte)(local_34 - 0x30) < 10) {
                    auStack_1080 = (undefined1  [8])0x10a7d4;
                    sVar10 = read(ls.ifd,&local_33,1);
                    if (((sVar10 != -1) && (local_33 == '~')) && (local_34 == 0x33))
                    goto LAB_0010a6b0;
                  }
                  else {
                    switch(local_34) {
                    case 0x41:
                      goto switchD_0010a5ea_caseD_10;
                    case 0x42:
                      goto switchD_0010a5ea_caseD_e;
                    case 0x43:
                      goto switchD_0010a5ea_caseD_6;
                    case 0x44:
                      goto switchD_0010a5ea_caseD_2;
                    case 0x46:
                      goto switchD_0010a5ea_caseD_5;
                    case 0x48:
                      goto switchD_0010a5ea_caseD_1;
                    }
                  }
                }
              }
            }
            break;
          default:
            if (local_31[0] == 0x7f) goto switchD_0010a5ea_caseD_8;
switchD_0010a5ea_caseD_7:
            auStack_1080 = (undefined1  [8])0x10a62f;
            iVar5 = linenoiseEditInsert(&ls,local_31[0]);
            if (iVar5 == 0) break;
LAB_0010a94d:
            unaff_R15 = (winsize *)0xffffffff;
LAB_0010a69b:
            bVar2 = true;
            goto LAB_0010a9e6;
          }
switchD_0010a982_caseD_45:
          bVar2 = false;
LAB_0010a9e6:
        } while (!bVar2);
      }
      iVar5 = (int)unaff_R15;
      if (ls.rawmode != 0) {
        auStack_1080 = (undefined1  [8])0x10aa12;
        iVar8 = tcsetattr(0,2,(termios *)&orig_termios);
        if (iVar8 != -1) {
          ls.rawmode = 0;
        }
      }
      auStack_1080 = (undefined1  [8])0x10aa2b;
      putchar(10);
      goto LAB_0010aa2b;
    }
  }
  iVar5 = -1;
LAB_0010aa2b:
  if (iVar5 == -1) {
    pcVar9 = (char *)0x0;
  }
  else {
LAB_0010aa31:
    auStack_1080 = (undefined1  [8])0x10aa3d;
    pcVar9 = strdup(local_1078);
  }
  return pcVar9;
code_r0x0010a0b5:
  unaff_R15 = unaff_R15 + 1;
  if (unaff_R15 == (winsize *)0x18) goto LAB_0010a0bf;
  goto LAB_0010a0a1;
}

Assistant:

char *linenoise(const char *prompt) {
    char buf[LINENOISE_MAX_LINE];
    int count;

    if (isUnsupportedTerm()) {
        size_t len;

        printf("%s",prompt);
        fflush(stdout);
        if (fgets(buf,LINENOISE_MAX_LINE,stdin) == NULL) return NULL;
        len = strlen(buf);
        while(len && (buf[len-1] == '\n' || buf[len-1] == '\r')) {
            len--;
            buf[len] = '\0';
        }
        return strdup(buf);
    } else {
        count = linenoiseRaw(buf,LINENOISE_MAX_LINE,prompt);
        if (count == -1) return NULL;
        return strdup(buf);
    }
}